

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
brotli::MoveToFrontTransform
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  bool bVar1;
  uint uVar2;
  const_iterator __first;
  reference puVar3;
  reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  size_t index_00;
  size_t index;
  size_t i_1;
  uint local_68;
  uint32_t i;
  allocator<unsigned_int> local_51;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> mtf;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  uint local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  uint32_t max_value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  
  pvStack_18 = v;
  v_local = __return_storage_ptr__;
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(v);
  if (bVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,pvStack_18);
  }
  else {
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvStack_18);
    mtf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvStack_18);
    local_28 = std::
               max_element<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                         (__first._M_current,
                          (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           )mtf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_28);
    local_1c = *puVar3;
    uVar2 = local_1c + 1;
    std::allocator<unsigned_int>::allocator(&local_51);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,(ulong)uVar2,
               &local_51);
    std::allocator<unsigned_int>::~allocator(&local_51);
    for (local_68 = 0; uVar2 = local_68, local_68 <= local_1c; local_68 = local_68 + 1) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                          (ulong)local_68);
      *pvVar4 = uVar2;
    }
    i_1._7_1_ = 0;
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvStack_18);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_1 + 6));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,sVar5,(allocator<unsigned_int> *)((long)&i_1 + 6));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_1 + 6));
    for (index = 0;
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvStack_18),
        index < sVar5; index = index + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvStack_18,index);
      index_00 = IndexOf((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,*pvVar6);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      if (sVar5 <= index_00) {
        __assert_fail("index < mtf.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/brotli_bit_stream.cc"
                      ,0x1ed,
                      "std::vector<uint32_t> brotli::MoveToFrontTransform(const std::vector<uint32_t> &)"
                     );
      }
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (__return_storage_ptr__,index);
      *pvVar4 = (value_type)index_00;
      MoveToFront((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,index_00);
    }
    i_1._7_1_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> MoveToFrontTransform(const std::vector<uint32_t>& v) {
  if (v.empty()) return v;
  uint32_t max_value = *std::max_element(v.begin(), v.end());
  std::vector<uint32_t> mtf(max_value + 1);
  for (uint32_t i = 0; i <= max_value; ++i) mtf[i] = i;
  std::vector<uint32_t> result(v.size());
  for (size_t i = 0; i < v.size(); ++i) {
    size_t index = IndexOf(mtf, v[i]);
    assert(index < mtf.size());
    result[i] = static_cast<uint32_t>(index);
    MoveToFront(&mtf, index);
  }
  return result;
}